

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-knowledge.c
# Opt level: O0

void shape_lore_append_basic_combat(textblock *tb,player_shape *s)

{
  bool bVar1;
  wchar_t local_9c;
  char *local_98;
  wchar_t n;
  char *msgs [3];
  char local_78 [8];
  char tod_msg [24];
  char local_58 [8];
  char toh_msg [24];
  char local_38 [8];
  char toa_msg [24];
  player_shape *s_local;
  textblock *tb_local;
  
  bVar1 = s->to_a != L'\0';
  if (bVar1) {
    strnfmt(local_38,0x18,"%+d to AC",(ulong)(uint)s->to_a);
    local_98 = local_38;
  }
  local_9c = (wchar_t)bVar1;
  if (s->to_h != L'\0') {
    strnfmt(local_58,0x18,"%+d to hit",(ulong)(uint)s->to_h);
    *(char **)(local_78 + (long)local_9c * 8 + -0x20) = local_58;
    local_9c = local_9c + L'\x01';
  }
  if (s->to_d != L'\0') {
    strnfmt(local_78,0x18,"%+d to damage",(ulong)(uint)s->to_d);
    *(char **)(local_78 + (long)local_9c * 8 + -0x20) = local_78;
    local_9c = local_9c + L'\x01';
  }
  if (local_9c != L'\0') {
    textblock_append(tb,"Adds");
    shape_lore_append_list(tb,&stack0xffffffffffffff68,local_9c);
    textblock_append(tb,".\n");
  }
  return;
}

Assistant:

static void shape_lore_append_basic_combat(textblock *tb,
	const struct player_shape *s)
{
	char toa_msg[24];
	char toh_msg[24];
	char tod_msg[24];
	const char* msgs[3];
	int n = 0;

	if (s->to_a != 0) {
		strnfmt(toa_msg, sizeof(toa_msg), "%+d to AC", s->to_a);
		msgs[n] = toa_msg;
		++n;
	}
	if (s->to_h != 0) {
		strnfmt(toh_msg, sizeof(toh_msg), "%+d to hit", s->to_h);
		msgs[n] = toh_msg;
		++n;
	}
	if (s->to_d != 0) {
		strnfmt(tod_msg, sizeof(tod_msg), "%+d to damage", s->to_d);
		msgs[n] = tod_msg;
		++n;
	}
	if (n > 0) {
		textblock_append(tb, "Adds");
		shape_lore_append_list(tb, msgs, n);
		textblock_append(tb, ".\n");
	}
}